

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicMinCase::verify
          (ShaderAtomicMinCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *this_00;
  ostringstream *poVar1;
  deUint32 needle;
  Precision precision;
  undefined8 uVar2;
  uint value;
  uint uVar3;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  deUint32 outputValue;
  int in_stack_00000008;
  long in_stack_00000010;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> outValues;
  set<int,_std::less<int>,_std::allocator<int>_> inValues;
  deInt32 inputValue;
  deUint32 local_264;
  undefined8 local_260;
  ulong local_258;
  ulong local_250;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  ulong local_230;
  ulong local_228;
  size_t local_220;
  size_t local_218;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_210;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  MessageBuilder local_1b0;
  
  local_238 = (int)tbs;
  uVar3 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  uVar6 = (long)((ulong)(uint)((int)ctx >> 0x1f) << 0x20 | (ulong)ctx & 0xffffffff) /
          (long)(int)uVar3;
  local_228 = uVar6 & 0xffffffff;
  local_230 = 0;
  if (0 < (int)uVar3) {
    local_230 = (ulong)uVar3;
  }
  local_258 = 0;
  if ((int)uVar6 < 1) {
    local_228 = 0;
  }
  local_234 = (int)sig;
  local_244 = uVar3 * local_234;
  local_240 = uVar3 * local_238;
  this_00 = &local_1b0.m_str;
  iVar4 = 0;
  local_260 = 0;
  local_250 = 0;
  local_220 = tbslen;
  local_218 = siglen;
  while (local_250 != local_228) {
    uVar3 = *(uint *)(in_stack_00000010 + (int)local_250 * in_stack_00000008);
    hex_01.value._4_4_ = 0;
    hex_01.value._0_4_ = uVar3;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0._M_impl.super__Rb_tree_header._M_header;
    local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_210._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_210._M_impl.super__Rb_tree_header._M_header;
    local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
    value = (this->super_ShaderAtomicOpCase).m_initialValue;
    uVar6 = local_230;
    local_23c = iVar4;
    local_210._M_impl.super__Rb_tree_header._M_header._M_right =
         local_210._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      local_1b0.m_log =
           (TestLog *)CONCAT44(local_1b0.m_log._4_4_,*(undefined4 *)(local_218 + (long)iVar4));
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_1e0,(int *)&local_1b0);
      if ((int)(uint)local_1b0.m_log < (int)value) {
        value = (uint)local_1b0.m_log;
      }
      iVar4 = iVar4 + local_234;
    }
    bVar7 = intEqualsAfterUintCast(value,uVar3,(this->super_ShaderAtomicOpCase).m_precision);
    if (!bVar7) {
      local_1b0.m_log =
           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: at group ");
      std::ostream::operator<<(poVar1,(int)local_250);
      std::operator<<((ostream *)poVar1,": expected minimum ");
      std::ostream::operator<<(poVar1,value);
      std::operator<<((ostream *)poVar1," (");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = value;
      tcu::Format::operator<<((ostream *)poVar1,hex);
      std::operator<<((ostream *)poVar1,")");
      std::operator<<((ostream *)poVar1,", got ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," (");
      tcu::Format::operator<<((ostream *)poVar1,hex_01);
      std::operator<<((ostream *)poVar1,")");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      uVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      local_260 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
    }
    uVar5 = local_258 & 0xffffffff;
    for (uVar6 = 0; local_230 != uVar6; uVar6 = uVar6 + 1) {
      needle = *(deUint32 *)(local_220 + (long)(int)uVar5);
      precision = (this->super_ShaderAtomicOpCase).m_precision;
      local_264 = needle;
      bVar7 = containsAfterUintCast
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_1e0,needle,
                         precision);
      if (!bVar7) {
        bVar7 = intEqualsAfterUintCast
                          ((this->super_ShaderAtomicOpCase).m_initialValue,needle,precision);
        if (!bVar7) {
          local_1b0.m_log =
               ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,"ERROR: at group ");
          std::ostream::operator<<(this_00,(int)local_250);
          std::operator<<((ostream *)this_00,", invocation ");
          std::ostream::operator<<(this_00,(int)uVar6);
          std::operator<<((ostream *)this_00,": found unexpected value ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::operator<<((ostream *)this_00," (");
          hex_00.value._4_4_ = 0;
          hex_00.value._0_4_ = local_264;
          tcu::Format::operator<<((ostream *)this_00,hex_00);
          std::operator<<((ostream *)this_00,")");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          uVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          local_260 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
        }
      }
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&local_210,&local_264);
      uVar5 = (ulong)(uint)((int)uVar5 + local_238);
    }
    bVar7 = containsAfterUintCast
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &local_210,(this->super_ShaderAtomicOpCase).m_initialValue,
                       (this->super_ShaderAtomicOpCase).m_precision);
    uVar6 = local_250;
    poVar1 = &local_1b0.m_str;
    if (!bVar7) {
      local_1b0.m_log =
           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: could not find initial value from group ");
      std::ostream::operator<<(poVar1,(int)uVar6);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      uVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      local_260 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_210);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_1e0);
    iVar4 = local_23c + local_244;
    local_258 = (ulong)(uint)((int)local_258 + local_240);
    local_250 = uVar6 + 1;
  }
  return (uint)CONCAT71((int7)((ulong)local_260 >> 8),~(byte)local_260) & 0xffffff01;
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;
		bool		anyError		= false;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			set<deInt32>	inValues;
			set<deUint32>	outValues;
			int				minValue		= (int)m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deInt32 inputValue = *(const deInt32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				inValues.insert(inputValue);
				minValue = de::min(inputValue, minValue);
			}

			if (!intEqualsAfterUintCast(minValue, groupOutput, m_precision))
			{
				m_testCtx.getLog()
					<< TestLog::Message
					<< "ERROR: at group " << groupNdx
					<< ": expected minimum " << minValue << " (" << tcu::Format::Hex<8>((deUint32)minValue) << ")"
					<< ", got " << groupOutput << " (" << tcu::Format::Hex<8>(groupOutput) << ")"
					<< TestLog::EndMessage;
				anyError = true;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if (!containsAfterUintCast(inValues, outputValue, m_precision) &&
					!intEqualsAfterUintCast((deInt32)m_initialValue, outputValue, m_precision))
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << outputValue
														   << " (" << tcu::Format::Hex<8>(outputValue) << ")"
									   << TestLog::EndMessage;
					anyError = true;
				}

				outValues.insert(outputValue);
			}

			if (!containsAfterUintCast(outValues, (int)m_initialValue, m_precision))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: could not find initial value from group " << groupNdx << TestLog::EndMessage;
				anyError = true;
			}
		}

		return !anyError;
	}